

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O2

void gprefs_from_str(char *str,keyvalwhere *mapping,int nvals,Conf *conf,int primary)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  char *ptr;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint secondary;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  char *__s2;
  
  ptr = dupstr(str);
  uVar6 = 0;
  if (0 < nvals) {
    uVar6 = (ulong)(uint)nvals;
  }
  secondary = 0;
  uVar12 = 0;
  pcVar3 = ptr;
  pcVar11 = ptr;
LAB_001323cb:
  do {
    while( true ) {
      __s2 = pcVar3;
      cVar1 = *__s2;
      if (cVar1 != ',') break;
      pcVar3 = __s2 + 1;
      pcVar11 = pcVar11 + 1;
    }
    pcVar11 = pcVar11 + 1;
    if (cVar1 == '\0') {
      safefree(ptr);
      do {
        if (nvals <= (int)secondary) {
          return;
        }
        for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
          uVar5 = mapping[uVar7].v;
          if ((int)uVar5 < 0) {
            __assert_fail("mapping[i].v >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c"
                          ,0x182,
                          "void gprefs_from_str(const char *, const struct keyvalwhere *, int, Conf *, int)"
                         );
          }
          if (0x1f < uVar5) {
            __assert_fail("mapping[i].v < 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c"
                          ,0x183,
                          "void gprefs_from_str(const char *, const struct keyvalwhere *, int, Conf *, int)"
                         );
          }
          if ((uVar12 & 1 << ((byte)uVar5 & 0x1f)) == 0) {
            uVar5 = secondary;
            if (mapping[uVar7].vrel == -1) {
              uVar9 = mapping[uVar7].where >> 0x1f & secondary;
            }
            else {
              if ((uVar12 & 1 << ((byte)mapping[uVar7].vrel & 0x1f)) == 0) goto LAB_001325a6;
              uVar9 = 0;
              uVar10 = 0;
              if (0 < (int)secondary) {
                uVar9 = 0;
                uVar10 = secondary;
              }
              while( true ) {
                if (uVar10 == uVar9) {
                  __assert_fail("j < n",
                                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/settings.c"
                                ,0x197,
                                "void gprefs_from_str(const char *, const struct keyvalwhere *, int, Conf *, int)"
                               );
                }
                iVar4 = conf_get_int_int(conf,primary,uVar9);
                if (iVar4 == mapping[uVar7].vrel) break;
                uVar9 = uVar9 + 1;
              }
              uVar9 = uVar9 - (~mapping[uVar7].where >> 0x1f);
            }
            while ((int)uVar9 < (int)uVar5) {
              iVar4 = conf_get_int_int(conf,primary,uVar5 - 1);
              conf_set_int_int(conf,primary,uVar5,iVar4);
              uVar5 = uVar5 - 1;
            }
            conf_set_int_int(conf,primary,uVar9,mapping[uVar7].v);
            uVar12 = uVar12 | 1 << ((byte)mapping[uVar7].v & 0x1f);
            secondary = secondary + 1;
          }
LAB_001325a6:
        }
      } while( true );
    }
    while (cVar1 != '\0') {
      if (cVar1 == ',') {
        pcVar11[-1] = '\0';
        goto LAB_00132405;
      }
      cVar1 = *pcVar11;
      pcVar11 = pcVar11 + 1;
    }
    pcVar11 = pcVar11 + -1;
LAB_00132405:
    lVar2 = 0;
    do {
      lVar8 = lVar2;
      pcVar3 = pcVar11;
      if (uVar6 * 0x18 + 0x18 == lVar8 + 0x18) goto LAB_001323cb;
      iVar4 = strcmp(*(char **)((long)&mapping->s + lVar8),__s2);
      lVar2 = lVar8 + 0x18;
    } while (iVar4 != 0);
    iVar4 = *(int *)((long)&mapping->v + lVar8);
    if ((iVar4 != -1) && (uVar5 = 1 << ((byte)iVar4 & 0x1f), (uVar12 & uVar5) == 0)) {
      uVar12 = uVar12 | uVar5;
      conf_set_int_int(conf,primary,secondary,iVar4);
      secondary = secondary + 1;
    }
  } while( true );
}

Assistant:

static void gprefs_from_str(const char *str,
                            const struct keyvalwhere *mapping, int nvals,
                            Conf *conf, int primary)
{
    char *commalist = dupstr(str);
    char *p, *q;
    int i, j, n, v, pos;
    unsigned long seen = 0;            /* bitmap for weeding dups etc */

    /*
     * Go through that list and convert it into values.
     */
    n = 0;
    p = commalist;
    while (1) {
        while (*p && *p == ',') p++;
        if (!*p)
            break;                     /* no more words */

        q = p;
        while (*p && *p != ',') p++;
        if (*p) *p++ = '\0';

        v = key2val(mapping, nvals, q);
        if (v != -1 && !(seen & (1 << v))) {
            seen |= (1 << v);
            conf_set_int_int(conf, primary, n, v);
            n++;
        }
    }

    sfree(commalist);

    /*
     * Now go through 'mapping' and add values that weren't mentioned
     * in the list we fetched. We may have to loop over it multiple
     * times so that we add values before other values whose default
     * positions depend on them.
     */
    while (n < nvals) {
        for (i = 0; i < nvals; i++) {
            assert(mapping[i].v >= 0);
            assert(mapping[i].v < 32);

            if (!(seen & (1 << mapping[i].v))) {
                /*
                 * This element needs adding. But can we add it yet?
                 */
                if (mapping[i].vrel != -1 && !(seen & (1 << mapping[i].vrel)))
                    continue;          /* nope */

                /*
                 * OK, we can work out where to add this element, so
                 * do so.
                 */
                if (mapping[i].vrel == -1) {
                    pos = (mapping[i].where < 0 ? n : 0);
                } else {
                    for (j = 0; j < n; j++)
                        if (conf_get_int_int(conf, primary, j) ==
                            mapping[i].vrel)
                            break;
                    assert(j < n);     /* implied by (seen & (1<<vrel)) */
                    pos = (mapping[i].where < 0 ? j : j+1);
                }

                /*
                 * And add it.
                 */
                for (j = n-1; j >= pos; j--)
                    conf_set_int_int(conf, primary, j+1,
                                     conf_get_int_int(conf, primary, j));
                conf_set_int_int(conf, primary, pos, mapping[i].v);
                seen |= (1 << mapping[i].v);
                n++;
            }
        }
    }
}